

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satStore.c
# Opt level: O0

char * Sto_ManMemoryFetch(Sto_Man_t *p,int nBytes)

{
  int iVar1;
  char *pcVar2;
  char *pMem;
  int nBytes_local;
  Sto_Man_t *p_local;
  
  if ((p->pChunkLast == (char *)0x0) || (p->nChunkSize - p->nChunkUsed < nBytes)) {
    pcVar2 = (char *)malloc((long)p->nChunkSize);
    *(char **)pcVar2 = p->pChunkLast;
    p->pChunkLast = pcVar2;
    p->nChunkUsed = 8;
  }
  iVar1 = p->nChunkUsed;
  p->nChunkUsed = nBytes + p->nChunkUsed;
  return p->pChunkLast + iVar1;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Fetches memory.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
char * Sto_ManMemoryFetch( Sto_Man_t * p, int nBytes )
{
    char * pMem;
    if ( p->pChunkLast == NULL || nBytes > p->nChunkSize - p->nChunkUsed )
    {
        pMem = (char *)ABC_ALLOC( char, p->nChunkSize );
        *(char **)pMem = p->pChunkLast;
        p->pChunkLast = pMem;
        p->nChunkUsed = sizeof(char *);
    }
    pMem = p->pChunkLast + p->nChunkUsed;
    p->nChunkUsed += nBytes;
    return pMem;
}